

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

UnaryOperator __thiscall Parser::unaryOperatorFromToken(Parser *this,Token *token)

{
  int iVar1;
  runtime_error *this_00;
  int *in_RSI;
  TokenType type;
  UnaryOperator local_4;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0xc) {
    local_4 = Minus;
  }
  else if (iVar1 == 0x13) {
    local_4 = LogicalNot;
  }
  else {
    if (iVar1 != 0x1e) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unexpected token for unary operator!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = BinaryNegation;
  }
  return local_4;
}

Assistant:

UnaryOperator Parser::unaryOperatorFromToken(const Token& token) const
{
  const auto type = token.type;
  switch(type)
  {
    case TokenType::Minus:
      return UnaryOperator::Minus;
    case TokenType::BinaryNot:
      return UnaryOperator::BinaryNegation;
    case TokenType::LogicalNot:
      return UnaryOperator::LogicalNot;
    default:
      throw std::runtime_error("Unexpected token for unary operator!");
  }
}